

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_alloc.cpp
# Opt level: O3

void * M_Realloc_Dbg(void *memblock,size_t size,char *file,int lineno)

{
  long lVar1;
  void *pvVar2;
  undefined4 in_register_0000000c;
  
  if (memblock != (void *)0x0) {
    lVar1 = malloc_usable_size(memblock,size,file,CONCAT44(in_register_0000000c,lineno));
    GC::AllocBytes = GC::AllocBytes - lVar1;
  }
  pvVar2 = realloc(memblock,size);
  if (pvVar2 == (void *)0x0) {
    I_FatalError("Could not realloc %zu bytes",size);
  }
  lVar1 = malloc_usable_size(pvVar2);
  GC::AllocBytes = GC::AllocBytes + lVar1;
  return pvVar2;
}

Assistant:

void *M_Realloc_Dbg(void *memblock, size_t size, const char *file, int lineno)
{
	if (memblock != NULL)
	{
		GC::AllocBytes -= _msize(memblock);
	}
	void *block = _realloc_dbg(memblock, size, _NORMAL_BLOCK, file, lineno);
	if (block == NULL)
	{
		I_FatalError("Could not realloc %zu bytes", size);
	}
	GC::AllocBytes += _msize(block);
	return block;
}